

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testSharedFrameBuffer.cpp
# Opt level: O3

void testSharedFrameBuffer(string *tempDir)

{
  pointer pcVar1;
  double dVar2;
  void *pvVar3;
  bool bVar4;
  long *plVar5;
  short sVar6;
  ulong uVar7;
  int iVar8;
  RgbaChannels in_R8D;
  Compression in_R9D;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  Array2D<Imf_2_5::Rgba> *p1_00;
  float fVar12;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  Array2D<Imf_2_5::Rgba> p1;
  long *local_b0 [2];
  long local_a0 [2];
  int local_8c;
  undefined1 local_88 [16];
  long local_70;
  undefined8 local_68;
  long local_60;
  void *local_58;
  ulong local_50;
  double local_48;
  double local_40;
  double local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Testing reading from and writing to files using\nmultiple threads and a shared framebuffer"
             ,0x59);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  bVar4 = IlmThread_2_5::supportsThreads();
  if (bVar4) {
    local_68 = 0x9f;
    local_60 = 0x55b;
    local_58 = operator_new__(0x1a9c28);
    local_70 = 0;
    iVar8 = 0;
    uVar7 = 0;
    do {
      local_40 = (double)(int)uVar7 * 0.2;
      local_48 = (double)(int)uVar7 * 0.3;
      uVar9 = 0;
      local_8c = iVar8;
      local_50 = uVar7;
      do {
        pvVar3 = local_58;
        lVar11 = local_60;
        dVar2 = Imath_2_5::erand48((ushort *)&(anonymous_namespace)::rand1);
        fVar12 = (float)((1.0 - dVar2) * -0.009999999776482582 + dVar2 * -0.009999999776482582 +
                        (double)(iVar8 + (int)((uVar7 & 0xffffffff) / 100) * -10000 +
                                 (int)((uVar9 & 0xffffffff) / 100) * -100 + (int)uVar9));
        if ((fVar12 != 0.0) || (NAN(fVar12))) {
          if (half::_eLut[(uint)fVar12 >> 0x17] == 0) {
            sVar6 = half::convert((int)fVar12);
          }
          else {
            sVar6 = half::_eLut[(uint)fVar12 >> 0x17] +
                    (short)(((uint)fVar12 & 0x7fffff) + 0xfff +
                            (uint)(((uint)fVar12 >> 0xd & 1) != 0) >> 0xd);
          }
        }
        else {
          sVar6 = (short)((uint)fVar12 >> 0x10);
        }
        lVar11 = lVar11 * local_70;
        local_38 = (double)(int)uVar9;
        *(short *)((long)pvVar3 + uVar9 * 8 + lVar11) = sVar6;
        dVar2 = sin(local_38 * 0.1 + local_40);
        local_88._8_4_ = extraout_XMM0_Dc;
        local_88._0_8_ = dVar2;
        local_88._12_4_ = extraout_XMM0_Dd;
        dVar2 = Imath_2_5::erand48((ushort *)&(anonymous_namespace)::rand1);
        fVar12 = (float)((1.0 - dVar2) * -0.009999999776482582 + dVar2 * -0.009999999776482582 +
                        (double)local_88._0_8_ * 0.5 + 0.5);
        if ((fVar12 != 0.0) || (NAN(fVar12))) {
          if (half::_eLut[(uint)fVar12 >> 0x17] == 0) {
            sVar6 = half::convert((int)fVar12);
          }
          else {
            sVar6 = half::_eLut[(uint)fVar12 >> 0x17] +
                    (short)(((uint)fVar12 & 0x7fffff) + 0xfff +
                            (uint)(((uint)fVar12 >> 0xd & 1) != 0) >> 0xd);
          }
        }
        else {
          sVar6 = (short)((uint)fVar12 >> 0x10);
        }
        *(short *)((long)pvVar3 + uVar9 * 8 + lVar11 + 2) = sVar6;
        dVar2 = sin(local_38 * 0.1 + local_48);
        local_88._8_4_ = extraout_XMM0_Dc_00;
        local_88._0_8_ = dVar2;
        local_88._12_4_ = extraout_XMM0_Dd_00;
        dVar2 = Imath_2_5::erand48((ushort *)&(anonymous_namespace)::rand1);
        fVar12 = (float)((1.0 - dVar2) * -0.009999999776482582 + dVar2 * -0.009999999776482582 +
                        (double)local_88._0_8_ * 0.5 + 0.5);
        if ((fVar12 != 0.0) || (NAN(fVar12))) {
          if (half::_eLut[(uint)fVar12 >> 0x17] == 0) {
            sVar6 = half::convert((int)fVar12);
          }
          else {
            sVar6 = half::_eLut[(uint)fVar12 >> 0x17] +
                    (short)(((uint)fVar12 & 0x7fffff) + 0xfff +
                            (uint)(((uint)fVar12 >> 0xd & 1) != 0) >> 0xd);
          }
        }
        else {
          sVar6 = (short)((uint)fVar12 >> 0x10);
        }
        *(short *)((long)pvVar3 + uVar9 * 8 + lVar11 + 4) = sVar6;
        dVar2 = Imath_2_5::erand48((ushort *)&(anonymous_namespace)::rand1);
        fVar12 = (float)((1.0 - dVar2) * 0.0 + dVar2);
        if ((fVar12 != 0.0) || (NAN(fVar12))) {
          if (half::_eLut[(uint)fVar12 >> 0x17] == 0) {
            sVar6 = half::convert((int)fVar12);
          }
          else {
            sVar6 = half::_eLut[(uint)fVar12 >> 0x17] +
                    (short)(((uint)fVar12 & 0x7fffff) + 0xfff +
                            (uint)(((uint)fVar12 >> 0xd & 1) != 0) >> 0xd);
          }
        }
        else {
          sVar6 = (short)((uint)fVar12 >> 0x10);
        }
        *(short *)((long)pvVar3 + uVar9 * 8 + lVar11 + 6) = sVar6;
        uVar9 = uVar9 + 1;
      } while (uVar9 != 0x55b);
      uVar7 = local_50 + 1;
      iVar8 = local_8c + 100;
      local_70 = local_70 + 8;
    } while (uVar7 != 0x9f);
    uVar7 = 0;
    do {
      local_88._0_8_ = uVar7;
      Imf_2_5::setGlobalThreadCount((int)uVar7 * 3 & 7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"number of threads: ",0x13);
      iVar8 = Imf_2_5::globalThreadCount();
      plVar5 = (long *)std::ostream::operator<<(&std::cout,iVar8);
      std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
      std::ostream::put((char)plVar5);
      std::ostream::flush();
      p1_00 = (Array2D<Imf_2_5::Rgba> *)0x0;
      do {
        pcVar1 = (tempDir->_M_dataplus)._M_p;
        local_b0[0] = local_a0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_b0,pcVar1,pcVar1 + tempDir->_M_string_length);
        std::__cxx11::string::append((char *)local_b0);
        iVar8 = (int)&local_68;
        anon_unknown.dwarf_2a16e8::writeReadRGBA((char *)local_b0[0],iVar8,0xf,p1_00,in_R8D,in_R9D);
        if (local_b0[0] != local_a0) {
          operator_delete(local_b0[0],local_a0[0] + 1);
        }
        pcVar1 = (tempDir->_M_dataplus)._M_p;
        local_b0[0] = local_a0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_b0,pcVar1,pcVar1 + tempDir->_M_string_length);
        std::__cxx11::string::append((char *)local_b0);
        anon_unknown.dwarf_2a16e8::writeReadRGBA((char *)local_b0[0],iVar8,7,p1_00,in_R8D,in_R9D);
        if (local_b0[0] != local_a0) {
          operator_delete(local_b0[0],local_a0[0] + 1);
        }
        pcVar1 = (tempDir->_M_dataplus)._M_p;
        local_b0[0] = local_a0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_b0,pcVar1,pcVar1 + tempDir->_M_string_length);
        std::__cxx11::string::append((char *)local_b0);
        anon_unknown.dwarf_2a16e8::writeReadRGBA((char *)local_b0[0],iVar8,8,p1_00,in_R8D,in_R9D);
        if (local_b0[0] != local_a0) {
          operator_delete(local_b0[0],local_a0[0] + 1);
        }
        pcVar1 = (tempDir->_M_dataplus)._M_p;
        local_b0[0] = local_a0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_b0,pcVar1,pcVar1 + tempDir->_M_string_length);
        std::__cxx11::string::append((char *)local_b0);
        anon_unknown.dwarf_2a16e8::writeReadRGBA((char *)local_b0[0],iVar8,5,p1_00,in_R8D,in_R9D);
        if (local_b0[0] != local_a0) {
          operator_delete(local_b0[0],local_a0[0] + 1);
        }
        uVar10 = (int)p1_00 + 1;
        p1_00 = (Array2D<Imf_2_5::Rgba> *)(ulong)uVar10;
      } while (uVar10 != 10);
      uVar10 = local_88._0_4_ + 1;
      uVar7 = (ulong)uVar10;
    } while (uVar10 != 9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ok\n",3);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
    std::ostream::put('p');
    std::ostream::flush();
    if (local_58 != (void *)0x0) {
      operator_delete__(local_58);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   Threading not supported!",0x1b);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
    std::ostream::put('p');
    plVar5 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
    std::ostream::put((char)plVar5);
    std::ostream::flush();
  }
  return;
}

Assistant:

void
testSharedFrameBuffer (const std::string &tempDir)
{
    try
    {
	cout << "Testing reading from and writing to files using\n"
		"multiple threads and a shared framebuffer" << endl;

        if (!ILMTHREAD_NAMESPACE::supportsThreads ())
        {
            cout << "   Threading not supported!" << endl << endl;
            return;
        }
                
	const int W = 1371;
	const int H = 159;
        
	Array2D<Rgba> p1 (H, W);
	fillPixels (p1, W, H);
        
        for (int n = 0; n <= 8; n++)
        {
            int numThreads = (n * 3) % 8;

            setGlobalThreadCount (numThreads);
            cout << "number of threads: " << globalThreadCount () << endl;

            for (int comp = 0; comp < NUM_COMPRESSION_METHODS; ++comp)
            {
                writeReadRGBA ((tempDir + "imf_test_rgba.exr").c_str(),
                                W, H, p1,
                                WRITE_RGBA,
                                Compression (comp));

                writeReadRGBA ((tempDir + "imf_test_rgba.exr").c_str(),
                                W, H, p1,
                                WRITE_RGB,
                                Compression (comp));

                writeReadRGBA ((tempDir + "imf_test_rgba.exr").c_str(),
                                W, H, p1,
                                WRITE_A,
                                Compression (comp));

                writeReadRGBA ((tempDir + "imf_test_rgba.exr").c_str(),
                                W, H, p1,
                                RgbaChannels (WRITE_R | WRITE_B),
                                Compression (comp));
            }
        }

	cout << "ok\n" << endl;
    }
    catch (const std::exception &e)
    {
	cerr << "ERROR -- caught exception: " << e.what() << endl;
	assert (false);
    }
}